

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O0

bool __thiscall Snake::SnakeCell(Snake *this,int x,int y)

{
  bool bVar1;
  reference pSVar2;
  SDL_Point *item;
  iterator __end1;
  iterator __begin1;
  vector<SDL_Point,_std::allocator<SDL_Point>_> *__range1;
  int y_local;
  int x_local;
  Snake *this_local;
  
  if ((x == (int)this->head_x) && (y == (int)this->head_y)) {
    this_local._7_1_ = true;
  }
  else {
    __end1 = std::vector<SDL_Point,_std::allocator<SDL_Point>_>::begin(&this->body);
    item = (SDL_Point *)std::vector<SDL_Point,_std::allocator<SDL_Point>_>::end(&this->body);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_>
                                       *)&item), bVar1) {
      pSVar2 = __gnu_cxx::
               __normal_iterator<SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_>::
               operator*(&__end1);
      if ((x == pSVar2->x) && (y == pSVar2->y)) {
        return true;
      }
      __gnu_cxx::__normal_iterator<SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Snake::SnakeCell(int x, int y) {
    if (x == static_cast<int>(head_x) && y == static_cast<int>(head_y)) {
        return true;
    }
    for (auto const &item : body) {
        if (x == item.x && y == item.y) {
            return true;
        }
    }
    return false;
}